

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void exp_add_token(lyxp_expr *exp,lyxp_token token,uint16_t expr_pos,uint16_t tok_len)

{
  lyxp_token *plVar1;
  LY_ERR *pLVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  uint16_t tok_len_local;
  uint16_t expr_pos_local;
  lyxp_token token_local;
  lyxp_expr *exp_local;
  
  if (exp->used == exp->size) {
    exp->size = exp->size + 5;
    plVar1 = (lyxp_token *)ly_realloc(exp->tokens,(ulong)exp->size << 2);
    exp->tokens = plVar1;
    if (exp->tokens == (lyxp_token *)0x0) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","exp_add_token");
      return;
    }
    puVar3 = (uint16_t *)ly_realloc(exp->expr_pos,(ulong)exp->size << 1);
    exp->expr_pos = puVar3;
    if (exp->expr_pos == (uint16_t *)0x0) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","exp_add_token");
      return;
    }
    puVar4 = (uint8_t *)ly_realloc(exp->tok_len,(ulong)exp->size);
    exp->tok_len = puVar4;
    if (exp->tok_len == (uint8_t *)0x0) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","exp_add_token");
      return;
    }
  }
  exp->tokens[exp->used] = token;
  exp->expr_pos[exp->used] = expr_pos;
  exp->tok_len[exp->used] = (uint8_t)tok_len;
  exp->used = exp->used + 1;
  return;
}

Assistant:

static void
exp_add_token(struct lyxp_expr *exp, enum lyxp_token token, uint16_t expr_pos, uint16_t tok_len)
{
    if (exp->used == exp->size) {
        exp->size += LYXP_EXPR_SIZE_STEP;
        exp->tokens = ly_realloc(exp->tokens, exp->size * sizeof *exp->tokens);
        if (!exp->tokens) {
            LOGMEM;
            return;
        }
        exp->expr_pos = ly_realloc(exp->expr_pos, exp->size * sizeof *exp->expr_pos);
        if (!exp->expr_pos) {
            LOGMEM;
            return;
        }
        exp->tok_len = ly_realloc(exp->tok_len, exp->size * sizeof *exp->tok_len);
        if (!exp->tok_len) {
            LOGMEM;
            return;
        }
    }

    exp->tokens[exp->used] = token;
    exp->expr_pos[exp->used] = expr_pos;
    exp->tok_len[exp->used] = tok_len;
    ++exp->used;
}